

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void __thiscall cs::statement_foreach::dump(statement_foreach *this,ostream *o)

{
  _Elt_pointer ppsVar1;
  ostream *poVar2;
  statement_base **ptr;
  _Elt_pointer ppsVar3;
  _Elt_pointer ppsVar4;
  _Map_pointer pppsVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(o,"< BeginForEach >\n",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(o,"< IteratorID = \"",0x10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (o,(this->mIt)._M_dataplus._M_p,(this->mIt)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\", TargetValue = ",0x11);
  compiler_type::dump_expr((this->mObj).mRoot,o);
  std::__ostream_insert<char,std::char_traits<char>>(o," >\n< Body >\n",0xc);
  ppsVar3 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  ppsVar1 = (this->mBlock).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppsVar3 != ppsVar1) {
    ppsVar4 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_last;
    pppsVar5 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      (*(*ppsVar3)->_vptr_statement_base[5])(*ppsVar3,o);
      ppsVar3 = ppsVar3 + 1;
      if (ppsVar3 == ppsVar4) {
        ppsVar3 = pppsVar5[1];
        pppsVar5 = pppsVar5 + 1;
        ppsVar4 = ppsVar3 + 0x40;
      }
    } while (ppsVar3 != ppsVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,"< EndForEach >\n",0xf);
  return;
}

Assistant:

void statement_foreach::dump(std::ostream &o) const
	{
		o << "< BeginForEach >\n";
		o << "< IteratorID = \"" << mIt << "\", TargetValue = ";
		compiler_type::dump_expr(mObj.root(), o);
		o << " >\n< Body >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndForEach >\n";
	}